

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmwrtimg.cpp
# Opt level: O2

void __thiscall CVmImageWriter::begin_srcf_block(CVmImageWriter *this,int count)

{
  begin_block(this,"SRCF",0);
  CVmFile::write_uint2(this->fp_,count);
  CVmFile::write_uint2(this->fp_,8);
  return;
}

Assistant:

void CVmImageWriter::begin_srcf_block(int count)
{
    /* 
     *   begin the block - SRCF blocks are always optional, since they're
     *   purely for debugging purposes 
     */
    begin_block("SRCF", FALSE);

    /* write the number of entries */
    fp_->write_uint2(count);

    /* each source line record is 8 bytes in the current format */
    fp_->write_uint2(8);
}